

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethercatcoe.c
# Opt level: O1

int ecx_readODlist(ecx_contextt *context,uint16 Slave,ec_ODlistt *pODlist)

{
  ushort uVar1;
  bool bVar2;
  uint8 uVar3;
  ushort uVar4;
  int iVar5;
  ulong uVar6;
  ushort uVar7;
  uint uVar8;
  undefined6 in_register_00000032;
  bool bVar9;
  ec_mbxbuft MbxIn;
  ec_mbxbuft MbxOut;
  uint local_874;
  ec_errort local_864;
  ec_ODlistt *local_848;
  uint16 *local_840;
  ushort local_838 [2];
  byte local_833;
  byte local_830;
  short local_82e;
  uint8 local_82c [1012];
  uint8 local_438 [5];
  byte local_433;
  uint8 local_432 [1026];
  
  pODlist->Slave = Slave;
  pODlist->Entries = 0;
  ec_clearmbx((ec_mbxbuft *)local_838);
  ecx_mbxreceive(context,Slave,(ec_mbxbuft *)local_838,0);
  ec_clearmbx((ec_mbxbuft *)local_438);
  local_438[0] = '\b';
  local_438[1] = '\0';
  local_438[2] = '\0';
  local_438[3] = '\0';
  local_438[4] = '\0';
  uVar6 = CONCAT62(in_register_00000032,Slave) & 0xffffffff;
  uVar3 = ec_nextmbxcnt(context->slavelist[uVar6].mbx_cnt);
  context->slavelist[uVar6].mbx_cnt = uVar3;
  local_433 = uVar3 << 4 | 3;
  local_432[0] = '\0';
  local_432[1] = 0x80;
  local_432[2] = '\x01';
  local_432[3] = '\0';
  local_432[4] = '\0';
  local_432[5] = '\0';
  local_432[6] = '\x01';
  local_432[7] = '\0';
  iVar5 = ecx_mbxsend(context,Slave,(ec_mbxbuft *)local_438,20000);
  if (0 < iVar5) {
    local_840 = pODlist->Index;
    bVar2 = true;
    uVar4 = 1;
    uVar7 = 0;
    local_874 = 0;
    local_848 = pODlist;
    do {
      ec_clearmbx((ec_mbxbuft *)local_838);
      iVar5 = ecx_mbxreceive(context,Slave,(ec_mbxbuft *)local_838,700000);
      if (iVar5 < 1) {
        bVar9 = false;
      }
      else if (((local_833 & 0xf) == 3) && ((local_830 & 0x7f) == 2)) {
        uVar8 = (int)((((uint)local_838[0] + (uint)!bVar2 * 2) -
                      ((int)((uint)local_838[0] + (uint)!bVar2 * 2 + -8) >> 0x1f)) + -8) >> 1;
        if (0x400 < (uVar8 & 0xffff) + (local_874 & 0xffff)) {
          uVar8 = 0x401 - local_874;
          local_864.Index = 0;
          local_864.SubIdx = '\0';
          *context->ecaterror = '\x01';
          local_864._16_8_ = 0xf00000000000004;
          local_864.Slave = Slave;
          ecx_pusherror(context,&local_864);
        }
        uVar1 = local_848->Entries;
        if (0x400 < (uVar8 & 0xffff) + (uint)uVar1) {
          uVar8 = 0x400 - uVar1;
        }
        local_848->Entries = uVar1 + (short)uVar8;
        if ((short)uVar8 != 0) {
          memcpy(local_840 + (ushort)local_874,local_82c + (ulong)uVar4 * 2,
                 (ulong)((uVar8 & 0xffff) * 2));
        }
        local_874 = local_874 + uVar8;
        bVar9 = local_82e != 0;
        uVar4 = 0;
        bVar2 = false;
      }
      else {
        if ((local_830 & 0x7f) == 7) {
          local_864.Index = 0;
          local_864.SubIdx = '\0';
          *context->ecaterror = '\x01';
          local_864.field_6.AbortCode._0_1_ = local_82c[0];
          local_864.field_6.AbortCode._1_1_ = local_82c[1];
          local_864.field_6.field_1.ErrorReg = local_82c[2];
          local_864.field_6.field_1.b1 = local_82c[3];
          local_864.Etype = EC_ERR_TYPE_SDOINFO_ERROR;
          local_864.Slave = Slave;
          ecx_pusherror(context,&local_864);
        }
        else {
          ecx_packeterror(context,Slave,0,'\0',1);
        }
        uVar7 = uVar7 + 0x14;
        bVar9 = false;
        iVar5 = 0;
      }
      uVar7 = uVar7 + 1;
    } while ((uVar7 < 0x81) && (bVar9));
  }
  return iVar5;
}

Assistant:

int ecx_readODlist(ecx_contextt *context, uint16 Slave, ec_ODlistt *pODlist)
{
   ec_SDOservicet *SDOp, *aSDOp;
   ec_mbxbuft MbxIn, MbxOut;
   int wkc;
   uint16 x, n, i, sp, offset;
   boolean stop;
   uint8 cnt;
   boolean First;

   pODlist->Slave = Slave;
   pODlist->Entries = 0;
   ec_clearmbx(&MbxIn);
   /* clear pending out mailbox in slave if available. Timeout is set to 0 */
   wkc = ecx_mbxreceive(context, Slave, &MbxIn, 0);
   ec_clearmbx(&MbxOut);
   aSDOp = (ec_SDOservicet*)&MbxIn;
   SDOp = (ec_SDOservicet*)&MbxOut;
   SDOp->MbxHeader.length = htoes(0x0008);
   SDOp->MbxHeader.address = htoes(0x0000);
   SDOp->MbxHeader.priority = 0x00;
   /* Get new mailbox counter value */
   cnt = ec_nextmbxcnt(context->slavelist[Slave].mbx_cnt);
   context->slavelist[Slave].mbx_cnt = cnt;
   SDOp->MbxHeader.mbxtype = ECT_MBXT_COE + (cnt << 4); /* CoE */
   SDOp->CANOpen = htoes(0x000 + (ECT_COES_SDOINFO << 12)); /* number 9bits service upper 4 bits */
   SDOp->Opcode = ECT_GET_ODLIST_REQ; /* get object description list request */
   SDOp->Reserved = 0;
   SDOp->Fragments = 0; /* fragments left */
   SDOp->wdata[0] = htoes(0x01); /* all objects */
   /* send get object description list request to slave */
   wkc = ecx_mbxsend(context, Slave, &MbxOut, EC_TIMEOUTTXM);
   /* mailbox placed in slave ? */
   if (wkc > 0)
   {
      x = 0; 
      sp = 0;
      First = TRUE;
      offset = 1; /* offset to skip info header in first frame, otherwise set to 0 */
      do
      {
         stop = TRUE; /* assume this is last iteration */
         ec_clearmbx(&MbxIn);
         /* read slave response */
         wkc = ecx_mbxreceive(context, Slave, &MbxIn, EC_TIMEOUTRXM);
         /* got response ? */
         if (wkc > 0)
         {
            /* response should be CoE and "get object description list response" */
            if (((aSDOp->MbxHeader.mbxtype & 0x0f) == ECT_MBXT_COE) &&
                ((aSDOp->Opcode & 0x7f) == ECT_GET_ODLIST_RES))
            {
               if (First)
               {   
                  /* extract number of indexes from mailbox data size */
                  n = (etohs(aSDOp->MbxHeader.length) - (6 + 2)) / 2;
               }
               else
               {
                  /* extract number of indexes from mailbox data size */
                  n = (etohs(aSDOp->MbxHeader.length) - 6) / 2;
               }
               /* check if indexes fit in buffer structure */
               if ((sp + n) > EC_MAXODLIST)
               {
                  n = EC_MAXODLIST + 1 - sp;
                  ecx_SDOinfoerror(context, Slave, 0, 0, 0xf000000); /* Too many entries for master buffer */
                  stop = TRUE;
               }
               /* trim to maximum number of ODlist entries defined */
               if ((pODlist->Entries + n) > EC_MAXODLIST)
               {
                  n = EC_MAXODLIST - pODlist->Entries;
               }
               pODlist->Entries += n;
               /* extract indexes one by one */
               for (i = 0; i < n; i++)
               {
                  pODlist->Index[sp + i] = etohs(aSDOp->wdata[i + offset]);
               }
               sp += n;
               /* check if more fragments will follow */
               if (aSDOp->Fragments > 0)
               {   
                  stop = FALSE;
               }
               First = FALSE; 
               offset = 0;
            }
            /* got unexpected response from slave */
            else
            {
               if ((aSDOp->Opcode &  0x7f) == ECT_SDOINFO_ERROR) /* SDO info error received */
               {
                  ecx_SDOinfoerror(context, Slave, 0, 0, etohl(aSDOp->ldata[0]));
                  stop = TRUE;
               }
               else
               {
                  ecx_packeterror(context, Slave, 0, 0, 1); /* Unexpected frame returned */
               }
               wkc = 0; 
               x += 20;
            }
         }
         x++;
      }
      while ((x <= 128) && !stop);
   }
   return wkc;
}